

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_socketpair.c
# Opt level: O2

nng_err nni_socket_pair(int *fds)

{
  int iVar1;
  nng_err nVar2;
  int *piVar3;
  
  iVar1 = socketpair(1,1,0,fds);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    nVar2 = nni_plat_errno(*piVar3);
    return nVar2;
  }
  return NNG_OK;
}

Assistant:

nng_err
nni_socket_pair(int fds[2])
{
	int rv;
	rv = socketpair(PF_UNIX, SOCK_STREAM, 0, fds);
	if (rv != 0) {
		return (nni_plat_errno(errno));
	}

#ifdef SO_NOSIGPIPE
	int set = 1;
	setsockopt(
	    fds[0], SOL_SOCKET, SO_NOSIGPIPE, (void *) &set, sizeof(int));
	setsockopt(
	    fds[1], SOL_SOCKET, SO_NOSIGPIPE, (void *) &set, sizeof(int));
#endif

	return (0);
}